

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O1

TestCaseGroup * vkt::SpirVAssembly::createOpLineTests(TestContext *testCtx)

{
  _Base_ptr *pp_Var1;
  long *plVar2;
  mapped_type *pmVar3;
  _Base_ptr p_Var4;
  size_type *psVar5;
  ulong *puVar6;
  size_t num4ByteChars;
  long lVar7;
  ulong uVar8;
  string local_180;
  undefined1 local_160 [32];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  testFragments;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  string local_100;
  TestCaseGroup *local_e0;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  problemStrings;
  string local_b8;
  vector<int,_std::allocator<int>_> local_98;
  RGBA defaultColors [4];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  fragments;
  
  defaultColors[0].m_value = 0;
  defaultColors[1].m_value = 0;
  defaultColors[2].m_value = 0;
  defaultColors[3].m_value = 0;
  local_e0 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(local_e0,testCtx,"opline","OpLine instruction");
  fragments._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &fragments._M_t._M_impl.super__Rb_tree_header._M_header;
  fragments._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  fragments._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  fragments._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  problemStrings.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  problemStrings.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  problemStrings.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  fragments._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       fragments._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"empty_name","");
  local_160._0_8_ = local_160 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"");
  pp_Var1 = &testFragments._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p == &local_180.field_2) {
    testFragments._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)local_180.field_2._8_8_;
    testFragments._M_t._M_impl._0_8_ = pp_Var1;
  }
  else {
    testFragments._M_t._M_impl._0_8_ = local_180._M_dataplus._M_p;
  }
  testFragments._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)local_180.field_2._M_allocated_capacity;
  testFragments._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = local_180._M_string_length;
  local_180._M_string_length = 0;
  local_180.field_2._M_allocated_capacity =
       local_180.field_2._M_allocated_capacity & 0xffffffffffffff00;
  if ((_Base_ptr)local_160._0_8_ == (_Base_ptr)(local_160 + 0x10)) {
    local_110._8_8_ = local_160._24_8_;
    testFragments._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)&local_110;
  }
  else {
    testFragments._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)local_160._0_8_
    ;
  }
  local_110._M_allocated_capacity = local_160._16_8_;
  testFragments._M_t._M_impl.super__Rb_tree_header._M_node_count = local_160._8_8_;
  local_160._8_8_ = 0;
  local_160._16_8_ = local_160._16_8_ & 0xffffffffffffff00;
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  local_160._0_8_ = (_Base_ptr)(local_160 + 0x10);
  std::
  vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
            ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
              *)&problemStrings,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&testFragments);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)testFragments._M_t._M_impl.super__Rb_tree_header._M_header._M_right != &local_110) {
    operator_delete(testFragments._M_t._M_impl.super__Rb_tree_header._M_header._M_right,
                    local_110._M_allocated_capacity + 1);
  }
  if ((_Base_ptr *)testFragments._M_t._M_impl._0_8_ != pp_Var1) {
    operator_delete((void *)testFragments._M_t._M_impl._0_8_,
                    (ulong)((long)&(testFragments._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  if ((_Base_ptr)local_160._0_8_ != (_Base_ptr)(local_160 + 0x10)) {
    operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,(ulong)(local_180.field_2._M_allocated_capacity + 1))
    ;
  }
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"short_name","");
  local_160._0_8_ = local_160 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"short_name","");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p == &local_180.field_2) {
    testFragments._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)local_180.field_2._8_8_;
    testFragments._M_t._M_impl._0_8_ = pp_Var1;
  }
  else {
    testFragments._M_t._M_impl._0_8_ = local_180._M_dataplus._M_p;
  }
  testFragments._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)local_180.field_2._M_allocated_capacity;
  testFragments._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = local_180._M_string_length;
  local_180._M_string_length = 0;
  local_180.field_2._M_allocated_capacity =
       local_180.field_2._M_allocated_capacity & 0xffffffffffffff00;
  if ((_Base_ptr)local_160._0_8_ == (_Base_ptr)(local_160 + 0x10)) {
    local_110._8_8_ = local_160._24_8_;
    testFragments._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)&local_110;
  }
  else {
    testFragments._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)local_160._0_8_
    ;
  }
  local_110._M_allocated_capacity = local_160._16_8_;
  testFragments._M_t._M_impl.super__Rb_tree_header._M_node_count = local_160._8_8_;
  local_160._8_8_ = 0;
  local_160._16_8_ = local_160._16_8_ & 0xffffffffffffff00;
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  local_160._0_8_ = (_Base_ptr)(local_160 + 0x10);
  std::
  vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
            ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
              *)&problemStrings,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&testFragments);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)testFragments._M_t._M_impl.super__Rb_tree_header._M_header._M_right != &local_110) {
    operator_delete(testFragments._M_t._M_impl.super__Rb_tree_header._M_header._M_right,
                    local_110._M_allocated_capacity + 1);
  }
  if ((_Base_ptr *)testFragments._M_t._M_impl._0_8_ != pp_Var1) {
    operator_delete((void *)testFragments._M_t._M_impl._0_8_,
                    (ulong)((long)&(testFragments._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  if ((_Base_ptr)local_160._0_8_ != (_Base_ptr)(local_160 + 0x10)) {
    operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,(ulong)(local_180.field_2._M_allocated_capacity + 1))
    ;
  }
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"long_name","");
  (anonymous_namespace)::makeLongUTF8String_abi_cxx11_
            (&local_100,(_anonymous_namespace_ *)0xfffa,num4ByteChars);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_100);
  local_160._0_8_ = local_160 + 0x10;
  p_Var4 = (_Base_ptr)(plVar2 + 2);
  if ((_Base_ptr)*plVar2 == p_Var4) {
    local_160._16_8_ = *(undefined8 *)p_Var4;
    local_160._24_8_ = plVar2[3];
  }
  else {
    local_160._16_8_ = *(undefined8 *)p_Var4;
    local_160._0_8_ = (_Base_ptr)*plVar2;
  }
  testFragments._M_t._M_impl.super__Rb_tree_header._M_node_count = plVar2[1];
  *plVar2 = (long)p_Var4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p == &local_180.field_2) {
    testFragments._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)local_180.field_2._8_8_;
    testFragments._M_t._M_impl._0_8_ = pp_Var1;
  }
  else {
    testFragments._M_t._M_impl._0_8_ = local_180._M_dataplus._M_p;
  }
  testFragments._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)local_180.field_2._M_allocated_capacity;
  testFragments._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = local_180._M_string_length;
  local_180._M_string_length = 0;
  local_180.field_2._M_allocated_capacity =
       local_180.field_2._M_allocated_capacity & 0xffffffffffffff00;
  if ((_Base_ptr)local_160._0_8_ == (_Base_ptr)(local_160 + 0x10)) {
    local_110._8_8_ = local_160._24_8_;
    testFragments._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)&local_110;
  }
  else {
    testFragments._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)local_160._0_8_
    ;
  }
  local_110._M_allocated_capacity = local_160._16_8_;
  local_160._8_8_ = 0;
  local_160._16_8_ = local_160._16_8_ & 0xffffffffffffff00;
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  local_160._0_8_ = (_Base_ptr)(local_160 + 0x10);
  std::
  vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
            ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
              *)&problemStrings,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&testFragments);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)testFragments._M_t._M_impl.super__Rb_tree_header._M_header._M_right != &local_110) {
    operator_delete(testFragments._M_t._M_impl.super__Rb_tree_header._M_header._M_right,
                    local_110._M_allocated_capacity + 1);
  }
  if ((_Base_ptr *)testFragments._M_t._M_impl._0_8_ != pp_Var1) {
    operator_delete((void *)testFragments._M_t._M_impl._0_8_,
                    (ulong)((long)&(testFragments._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  if ((_Base_ptr)local_160._0_8_ != (_Base_ptr)(local_160 + 0x10)) {
    operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  getDefaultColors(&defaultColors);
  testFragments._M_t._M_impl._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&testFragments,"debug","");
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&fragments,(key_type *)&testFragments);
  std::__cxx11::string::_M_replace((ulong)pmVar3,0,(char *)pmVar3->_M_string_length,0xaed5b6);
  if ((_Base_ptr *)testFragments._M_t._M_impl._0_8_ != pp_Var1) {
    operator_delete((void *)testFragments._M_t._M_impl._0_8_,
                    (ulong)((long)&(testFragments._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  testFragments._M_t._M_impl._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&testFragments,"pre_main","");
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&fragments,(key_type *)&testFragments);
  std::__cxx11::string::_M_replace((ulong)pmVar3,0,(char *)pmVar3->_M_string_length,0xaed5db);
  if ((_Base_ptr *)testFragments._M_t._M_impl._0_8_ != pp_Var1) {
    operator_delete((void *)testFragments._M_t._M_impl._0_8_,
                    (ulong)((long)&(testFragments._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  testFragments._M_t._M_impl._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&testFragments,"testfun","");
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&fragments,(key_type *)&testFragments);
  std::__cxx11::string::_M_replace((ulong)pmVar3,0,(char *)pmVar3->_M_string_length,0xaed7f9);
  if ((_Base_ptr *)testFragments._M_t._M_impl._0_8_ != pp_Var1) {
    operator_delete((void *)testFragments._M_t._M_impl._0_8_,
                    (ulong)((long)&(testFragments._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  if (problemStrings.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      problemStrings.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar7 = 0x20;
    uVar8 = 0;
    do {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_Rb_tree(&testFragments._M_t,&fragments._M_t);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160,
                     "%file_name = OpString \"",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&((problemStrings.
                               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->first)._M_dataplus._M_p +
                     lVar7));
      plVar2 = (long *)std::__cxx11::string::append((char *)local_160);
      local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
      psVar5 = (size_type *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar5) {
        local_180.field_2._M_allocated_capacity = *psVar5;
        local_180.field_2._8_8_ = plVar2[3];
      }
      else {
        local_180.field_2._M_allocated_capacity = *psVar5;
        local_180._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_180._M_string_length = plVar2[1];
      *plVar2 = (long)psVar5;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"debug","");
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&testFragments._M_t,&local_100);
      std::__cxx11::string::_M_append((char *)pmVar3,(ulong)local_180._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._M_dataplus._M_p != &local_180.field_2) {
        operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
      }
      if ((_Base_ptr)local_160._0_8_ != (_Base_ptr)(local_160 + 0x10)) {
        operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
      }
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"opline","");
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_100);
      local_160._0_8_ = local_160 + 0x10;
      p_Var4 = (_Base_ptr)(plVar2 + 2);
      if ((_Base_ptr)*plVar2 == p_Var4) {
        local_160._16_8_ = *(undefined8 *)p_Var4;
        local_160._24_8_ = plVar2[3];
      }
      else {
        local_160._16_8_ = *(undefined8 *)p_Var4;
        local_160._0_8_ = (_Base_ptr)*plVar2;
      }
      local_160._8_8_ = plVar2[1];
      *plVar2 = (long)p_Var4;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      plVar2 = (long *)std::__cxx11::string::_M_append
                                 ((char *)local_160,
                                  *(ulong *)((long)problemStrings.
                                                                                                      
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                            lVar7 + -0x20));
      local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
      puVar6 = (ulong *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar6) {
        local_180.field_2._M_allocated_capacity = *puVar6;
        local_180.field_2._8_8_ = plVar2[3];
      }
      else {
        local_180.field_2._M_allocated_capacity = *puVar6;
        local_180._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_180._M_string_length = plVar2[1];
      *plVar2 = (long)puVar6;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      local_b8._M_string_length = 0;
      local_b8.field_2._M_local_buf[0] = '\0';
      local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      createTestsForAllStages
                (&local_180,&defaultColors,&defaultColors,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&testFragments._M_t,&local_98,local_e0,QP_TEST_RESULT_FAIL,&local_b8);
      if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,
                        CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                                 local_b8.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._M_dataplus._M_p != &local_180.field_2) {
        operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
      }
      if ((_Base_ptr)local_160._0_8_ != (_Base_ptr)(local_160 + 0x10)) {
        operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&testFragments._M_t);
      uVar8 = uVar8 + 1;
      lVar7 = lVar7 + 0x40;
    } while (uVar8 < (ulong)((long)problemStrings.
                                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)problemStrings.
                                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 6));
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&problemStrings);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&fragments._M_t);
  return local_e0;
}

Assistant:

tcu::TestCaseGroup* createOpLineTests(tcu::TestContext& testCtx)
{
	RGBA													defaultColors[4];
	de::MovePtr<tcu::TestCaseGroup>							opLineTests			(new tcu::TestCaseGroup(testCtx, "opline", "OpLine instruction"));
	map<string, string>										fragments;
	std::vector<std::pair<std::string, std::string> >		problemStrings;

	problemStrings.push_back(std::make_pair<std::string, std::string>("empty_name", ""));
	problemStrings.push_back(std::make_pair<std::string, std::string>("short_name", "short_name"));
	problemStrings.push_back(std::make_pair<std::string, std::string>("long_name", makeLongUTF8String(65530) + "ccc"));
	getDefaultColors(defaultColors);

	fragments["debug"]			=
		"%other_name = OpString \"other_name\"\n";

	fragments["pre_main"]	=
		"OpLine %file_name 32 0\n"
		"OpLine %file_name 32 32\n"
		"OpLine %file_name 32 40\n"
		"OpLine %other_name 32 40\n"
		"OpLine %other_name 0 100\n"
		"OpLine %other_name 0 4294967295\n"
		"OpLine %other_name 4294967295 0\n"
		"OpLine %other_name 32 40\n"
		"OpLine %file_name 0 0\n"
		"%second_function = OpFunction %v4f32 None %v4f32_function\n"
		"OpLine %file_name 1 0\n"
		"%second_param1 = OpFunctionParameter %v4f32\n"
		"OpLine %file_name 1 3\n"
		"OpLine %file_name 1 2\n"
		"%label_secondfunction = OpLabel\n"
		"OpLine %file_name 0 2\n"
		"OpReturnValue %second_param1\n"
		"OpFunctionEnd\n"
		"OpLine %file_name 0 2\n"
		"OpLine %file_name 0 2\n";

	fragments["testfun"]		=
		// A %test_code function that returns its argument unchanged.
		"OpLine %file_name 1 0\n"
		"%test_code = OpFunction %v4f32 None %v4f32_function\n"
		"OpLine %file_name 16 330\n"
		"%param1 = OpFunctionParameter %v4f32\n"
		"OpLine %file_name 14 442\n"
		"%label_testfun = OpLabel\n"
		"OpLine %file_name 11 1024\n"
		"%val1 = OpFunctionCall %v4f32 %second_function %param1\n"
		"OpLine %file_name 2 97\n"
		"OpReturnValue %val1\n"
		"OpFunctionEnd\n"
		"OpLine %file_name 5 32\n";

	for (size_t i = 0; i < problemStrings.size(); ++i)
	{
		map<string, string> testFragments = fragments;
		testFragments["debug"] += "%file_name = OpString \"" + problemStrings[i].second + "\"\n";
		createTestsForAllStages(string("opline") + "_" + problemStrings[i].first, defaultColors, defaultColors, testFragments, opLineTests.get());
	}

	return opLineTests.release();
}